

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O2

cmValue __thiscall
cmStandardLevelResolver::CompileFeaturesAvailable
          (cmStandardLevelResolver *this,string *lang,string *error)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmGlobalGenerator *this_00;
  cmValue cVar3;
  ostream *poVar4;
  string *psVar5;
  char *pcVar6;
  string local_1e0;
  string local_1c0;
  ostringstream e;
  
  this_00 = cmMakefile::GetGlobalGenerator(this->Makefile);
  bVar2 = cmGlobalGenerator::GetLanguageEnabled(this_00,lang);
  if (bVar2) {
    pcVar1 = this->Makefile;
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[18]>
              ((string *)&e,(char (*) [7])0x72f1a0,lang,(char (*) [18])0x75daba);
    cVar3 = cmMakefile::GetDefinition(pcVar1,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    if ((cVar3.Value != (string *)0x0) && ((cVar3.Value)->_M_string_length != 0)) {
      return (cmValue)cVar3.Value;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    pcVar6 = "no";
    if (error == (string *)0x0) {
      pcVar6 = "No";
    }
    std::operator<<((ostream *)&e,pcVar6);
    poVar4 = std::operator<<((ostream *)&e," known features for ");
    poVar4 = std::operator<<(poVar4,(string *)lang);
    poVar4 = std::operator<<(poVar4," compiler\n\"");
    pcVar1 = this->Makefile;
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[13]>
              (&local_1e0,(char (*) [7])0x72f1a0,lang,(char (*) [13])0x734179);
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_1e0);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    poVar4 = std::operator<<(poVar4,"\"\nversion ");
    pcVar1 = this->Makefile;
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[18]>
              (&local_1c0,(char (*) [7])0x72f1a0,lang,(char (*) [18])0x734190);
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_1c0);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    std::operator<<(poVar4,'.');
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    if (error == (string *)0x0) {
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1e0);
      goto LAB_002ca303;
    }
    std::__cxx11::stringbuf::str();
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    pcVar6 = "cannot";
    if (error == (string *)0x0) {
      pcVar6 = "Cannot";
    }
    std::operator<<((ostream *)&e,pcVar6);
    poVar4 = std::operator<<((ostream *)&e," use features from non-enabled language ");
    std::operator<<(poVar4,(string *)lang);
    if (error == (string *)0x0) {
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1e0);
      goto LAB_002ca303;
    }
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::string::operator=((string *)error,(string *)&local_1e0);
LAB_002ca303:
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return (cmValue)(string *)0x0;
}

Assistant:

cmValue cmStandardLevelResolver::CompileFeaturesAvailable(
  const std::string& lang, std::string* error) const
{
  if (!this->Makefile->GetGlobalGenerator()->GetLanguageEnabled(lang)) {
    std::ostringstream e;
    if (error) {
      e << "cannot";
    } else {
      e << "Cannot";
    }
    e << " use features from non-enabled language " << lang;
    if (error) {
      *error = e.str();
    } else {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    }
    return nullptr;
  }

  cmValue featuresKnown = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILE_FEATURES"));

  if (!cmNonempty(featuresKnown)) {
    std::ostringstream e;
    if (error) {
      e << "no";
    } else {
      e << "No";
    }
    e << " known features for " << lang << " compiler\n\""
      << this->Makefile->GetSafeDefinition(
           cmStrCat("CMAKE_", lang, "_COMPILER_ID"))
      << "\"\nversion "
      << this->Makefile->GetSafeDefinition(
           cmStrCat("CMAKE_", lang, "_COMPILER_VERSION"))
      << '.';
    if (error) {
      *error = e.str();
    } else {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    }
    return nullptr;
  }
  return featuresKnown;
}